

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_crease(REF_GRID ref_grid,REF_INT node,REF_DBL *dot_prod)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  REF_DBL RVar3;
  REF_DBL RVar4;
  REF_DBL RVar5;
  REF_DBL RVar6;
  uint uVar7;
  REF_ADJ pRVar8;
  ulong uVar9;
  undefined8 uVar10;
  ulong uVar11;
  REF_INT RVar12;
  char *pcVar13;
  double dVar14;
  double dVar15;
  REF_DBL area_sign1;
  REF_DBL area_sign0;
  REF_DBL n1 [3];
  REF_DBL n0 [3];
  REF_DBL uv [2];
  REF_DBL s [3];
  REF_DBL r [3];
  REF_INT nodes [27];
  
  pRVar1 = ref_grid->node;
  pRVar2 = ref_grid->cell[3];
  *dot_prod = 1.0;
  if (((-1 < node) && (node < pRVar1->max)) && (-1 < pRVar1->global[(uint)node])) {
    pRVar8 = pRVar2->ref_adj;
    RVar12 = -1;
    uVar9 = 0xffffffff;
    if (node < pRVar8->nnode) {
      uVar7 = pRVar8->first[(uint)node];
      uVar9 = 0xffffffff;
      if ((long)(int)uVar7 != -1) {
        RVar12 = pRVar8->item[(int)uVar7].ref;
        uVar9 = (ulong)uVar7;
      }
    }
    while( true ) {
      if ((int)uVar9 == -1) break;
      uVar7 = ref_cell_nodes(ref_grid->cell[3],RVar12,nodes);
      if (uVar7 != 0) {
        pcVar13 = "tri list for edge";
        uVar10 = 0x701;
LAB_001478cb:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               uVar10,"ref_geom_crease",(ulong)uVar7,pcVar13);
        return uVar7;
      }
      uVar7 = ref_geom_tri_centroid(ref_grid,nodes,uv);
      if (uVar7 != 0) {
        pcVar13 = "tri cent";
        uVar10 = 0x702;
        goto LAB_001478cb;
      }
      RVar12 = nodes[pRVar2->node_per];
      uVar7 = ref_geom_face_rsn(ref_grid->geom,RVar12,uv,r,s,n0);
      if (uVar7 != 0) {
        pcVar13 = "rsn";
        uVar10 = 0x704;
        goto LAB_001478cb;
      }
      uVar7 = ref_geom_uv_area_sign(ref_grid,RVar12,&area_sign0);
      RVar6 = n0[2];
      RVar5 = n0[1];
      RVar4 = n0[0];
      RVar3 = area_sign0;
      if (uVar7 != 0) {
        pcVar13 = "a sign";
        uVar10 = 0x705;
        goto LAB_001478cb;
      }
      pRVar8 = pRVar2->ref_adj;
      RVar12 = -1;
      uVar11 = 0xffffffff;
      if (node < pRVar8->nnode) {
        uVar7 = pRVar8->first[(uint)node];
        uVar11 = 0xffffffff;
        if ((long)(int)uVar7 != -1) {
          RVar12 = pRVar8->item[(int)uVar7].ref;
          uVar11 = (ulong)uVar7;
        }
      }
      while( true ) {
        if ((int)uVar11 == -1) break;
        uVar7 = ref_cell_nodes(ref_grid->cell[3],RVar12,nodes);
        if (uVar7 != 0) {
          pcVar13 = "tri list for edge";
          uVar10 = 0x708;
          goto LAB_001478cb;
        }
        uVar7 = ref_geom_tri_centroid(ref_grid,nodes,uv);
        if (uVar7 != 0) {
          pcVar13 = "tri cent";
          uVar10 = 0x709;
          goto LAB_001478cb;
        }
        RVar12 = nodes[pRVar2->node_per];
        uVar7 = ref_geom_face_rsn(ref_grid->geom,RVar12,uv,r,s,n1);
        if (uVar7 != 0) {
          pcVar13 = "rsn";
          uVar10 = 0x70b;
          goto LAB_001478cb;
        }
        uVar7 = ref_geom_uv_area_sign(ref_grid,RVar12,&area_sign1);
        if (uVar7 != 0) {
          pcVar13 = "a sign";
          uVar10 = 0x70c;
          goto LAB_001478cb;
        }
        dVar15 = (n1[2] * RVar6 + n1[0] * RVar4 + n1[1] * RVar5) * area_sign1 * RVar3;
        dVar14 = *dot_prod;
        if (dVar15 <= *dot_prod) {
          dVar14 = dVar15;
        }
        *dot_prod = dVar14;
        pRVar8 = pRVar2->ref_adj;
        uVar11 = (ulong)pRVar8->item[(int)uVar11].next;
        RVar12 = -1;
        if (uVar11 != 0xffffffffffffffff) {
          RVar12 = pRVar8->item[uVar11].ref;
        }
      }
      uVar9 = (ulong)pRVar8->item[(int)uVar9].next;
      RVar12 = -1;
      if (uVar9 != 0xffffffffffffffff) {
        RVar12 = pRVar8->item[uVar9].ref;
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_crease(REF_GRID ref_grid, REF_INT node,
                                   REF_DBL *dot_prod) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item0, item1, cell0, cell1, id;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL uv[2];
  REF_DBL r[3], s[3];
  REF_DBL n0[3], area_sign0;
  REF_DBL n1[3], area_sign1;

  *dot_prod = 1.0;

  if (!ref_node_valid(ref_node, node)) {
    return REF_SUCCESS;
  }

  each_ref_cell_having_node(ref_cell, node, item0, cell0) {
    RSS(ref_cell_nodes(ref_grid_tri(ref_grid), cell0, nodes),
        "tri list for edge");
    RSS(ref_geom_tri_centroid(ref_grid, nodes, uv), "tri cent");
    id = nodes[ref_cell_node_per(ref_cell)];
    RSS(ref_geom_face_rsn(ref_grid_geom(ref_grid), id, uv, r, s, n0), "rsn");
    RSS(ref_geom_uv_area_sign(ref_grid, id, &area_sign0), "a sign");
    each_ref_cell_having_node(ref_cell, node, item1, cell1) {
      RSS(ref_cell_nodes(ref_grid_tri(ref_grid), cell1, nodes),
          "tri list for edge");
      RSS(ref_geom_tri_centroid(ref_grid, nodes, uv), "tri cent");
      id = nodes[ref_cell_node_per(ref_cell)];
      RSS(ref_geom_face_rsn(ref_grid_geom(ref_grid), id, uv, r, s, n1), "rsn");
      RSS(ref_geom_uv_area_sign(ref_grid, id, &area_sign1), "a sign");

      *dot_prod =
          MIN(*dot_prod, area_sign0 * area_sign1 * ref_math_dot(n0, n1));
    }
  }

  return REF_SUCCESS;
}